

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_arith_add(DisasContext_conflict10 *ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2,
                     TCGv_i64 ca,TCGv_i64 ca32,_Bool add_ca,_Bool compute_ca,_Bool compute_ov,
                     _Bool compute_rc0)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  TCGv_i64 zero;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  _Bool compute_rc0_local;
  _Bool compute_ov_local;
  _Bool compute_ca_local;
  _Bool add_ca_local;
  TCGv_i64 ca32_local;
  TCGv_i64 ca_local;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((compute_ca) || (t1 = ret, compute_ov)) {
    t1 = tcg_temp_new_i64(tcg_ctx_00);
  }
  if (compute_ca) {
    if ((ctx->sf_mode & 1U) == 0) {
      pTVar1 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_xor_i64_ppc64(tcg_ctx_00,pTVar1,arg1,arg2);
      tcg_gen_add_i64(tcg_ctx_00,t1,arg1,arg2);
      if (add_ca) {
        tcg_gen_add_i64(tcg_ctx_00,t1,t1,ca);
      }
      tcg_gen_xor_i64_ppc64(tcg_ctx_00,ca,t1,pTVar1);
      tcg_temp_free_i64(tcg_ctx_00,pTVar1);
      tcg_gen_extract_i64_ppc64(tcg_ctx_00,ca,ca,0x20,1);
      if ((ctx->insns_flags2 & 0x80000) != 0) {
        tcg_gen_mov_i64_ppc64(tcg_ctx_00,ca32,ca);
      }
    }
    else {
      pTVar1 = tcg_const_i64_ppc64(tcg_ctx_00,0);
      if (add_ca) {
        tcg_gen_add2_i64_ppc64(tcg_ctx_00,t1,ca,arg1,pTVar1,ca,pTVar1);
        tcg_gen_add2_i64_ppc64(tcg_ctx_00,t1,ca,t1,ca,arg2,pTVar1);
      }
      else {
        tcg_gen_add2_i64_ppc64(tcg_ctx_00,t1,ca,arg1,pTVar1,arg2,pTVar1);
      }
      gen_op_arith_compute_ca32(ctx,t1,arg1,arg2,ca32,0);
      tcg_temp_free_i64(tcg_ctx_00,pTVar1);
    }
  }
  else {
    tcg_gen_add_i64(tcg_ctx_00,t1,arg1,arg2);
    if (add_ca) {
      tcg_gen_add_i64(tcg_ctx_00,t1,t1,ca);
    }
  }
  if (compute_ov) {
    gen_op_arith_compute_ov(ctx,t1,arg1,arg2,0);
  }
  if (compute_rc0) {
    gen_set_Rc0(ctx,t1);
  }
  if (t1 != ret) {
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,t1);
    tcg_temp_free_i64(tcg_ctx_00,t1);
  }
  return;
}

Assistant:

static inline void gen_op_arith_add(DisasContext *ctx, TCGv ret, TCGv arg1,
                                    TCGv arg2, TCGv ca, TCGv ca32,
                                    bool add_ca, bool compute_ca,
                                    bool compute_ov, bool compute_rc0)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = ret;

    if (compute_ca || compute_ov) {
        t0 = tcg_temp_new(tcg_ctx);
    }

    if (compute_ca) {
        if (NARROW_MODE(ctx)) {
            /*
             * Caution: a non-obvious corner case of the spec is that
             * we must produce the *entire* 64-bit addition, but
             * produce the carry into bit 32.
             */
            TCGv t1 = tcg_temp_new(tcg_ctx);
            tcg_gen_xor_tl(tcg_ctx, t1, arg1, arg2);        /* add without carry */
            tcg_gen_add_tl(tcg_ctx, t0, arg1, arg2);
            if (add_ca) {
                tcg_gen_add_tl(tcg_ctx, t0, t0, ca);
            }
            tcg_gen_xor_tl(tcg_ctx, ca, t0, t1);        /* bits changed w/ carry */
            tcg_temp_free(tcg_ctx, t1);
            tcg_gen_extract_tl(tcg_ctx, ca, ca, 32, 1);
            if (is_isa300(ctx)) {
                tcg_gen_mov_tl(tcg_ctx, ca32, ca);
            }
        } else {
            TCGv zero = tcg_const_tl(tcg_ctx, 0);
            if (add_ca) {
                tcg_gen_add2_tl(tcg_ctx, t0, ca, arg1, zero, ca, zero);
                tcg_gen_add2_tl(tcg_ctx, t0, ca, t0, ca, arg2, zero);
            } else {
                tcg_gen_add2_tl(tcg_ctx, t0, ca, arg1, zero, arg2, zero);
            }
            gen_op_arith_compute_ca32(ctx, t0, arg1, arg2, ca32, 0);
            tcg_temp_free(tcg_ctx, zero);
        }
    } else {
        tcg_gen_add_tl(tcg_ctx, t0, arg1, arg2);
        if (add_ca) {
            tcg_gen_add_tl(tcg_ctx, t0, t0, ca);
        }
    }

    if (compute_ov) {
        gen_op_arith_compute_ov(ctx, t0, arg1, arg2, 0);
    }
    if (unlikely(compute_rc0)) {
        gen_set_Rc0(ctx, t0);
    }

    if (t0 != ret) {
        tcg_gen_mov_tl(tcg_ctx, ret, t0);
        tcg_temp_free(tcg_ctx, t0);
    }
}